

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool parse_value(cJSON *item,parse_buffer *input_buffer)

{
  uchar uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  cJSON_bool cVar5;
  long lVar6;
  cJSON *pcVar7;
  ulong uVar8;
  cJSON *item_00;
  uint uVar9;
  uchar *puVar10;
  cJSON *pcVar11;
  cJSON *pcVar12;
  double dVar13;
  uchar *after_end;
  byte local_78 [72];
  
  if (input_buffer == (parse_buffer *)0x0) {
    return 0;
  }
  puVar10 = input_buffer->content;
  if (puVar10 == (uchar *)0x0) {
    return 0;
  }
  uVar2 = input_buffer->length;
  uVar3 = input_buffer->offset;
  uVar8 = uVar3 + 4;
  if ((uVar8 <= uVar2) && (iVar4 = strncmp((char *)(puVar10 + uVar3),"null",4), iVar4 == 0)) {
    item->type = 4;
    input_buffer->offset = uVar8;
    return 1;
  }
  if ((uVar3 + 5 <= uVar2) && (iVar4 = strncmp((char *)(puVar10 + uVar3),"false",5), iVar4 == 0)) {
    item->type = 1;
    input_buffer->offset = uVar3 + 5;
    return 1;
  }
  if ((uVar8 <= uVar2) && (iVar4 = strncmp((char *)(puVar10 + uVar3),"true",4), iVar4 == 0)) {
    item->type = 2;
    item->valueint = 1;
    input_buffer->offset = uVar8;
    return 1;
  }
  if (uVar2 <= uVar3) {
    return 0;
  }
  uVar1 = puVar10[uVar3];
  if (uVar1 == '\"') {
    cVar5 = parse_string(item,input_buffer);
    return cVar5;
  }
  puVar10 = puVar10 + uVar3;
  if (uVar1 == '-' || (byte)(uVar1 - 0x30) < 10) {
    after_end = (uchar *)0x0;
    for (lVar6 = 0; (lVar6 != 0x3f && (uVar3 + lVar6 < uVar2)); lVar6 = lVar6 + 1) {
      uVar9 = puVar10[lVar6] - 0x2b;
      if ((0x3a < uVar9) || ((0x400000004007fedU >> ((ulong)uVar9 & 0x3f) & 1) == 0)) break;
      local_78[lVar6] = puVar10[lVar6];
    }
    local_78[lVar6] = 0;
    dVar13 = strtod((char *)local_78,(char **)&after_end);
    if (local_78 == after_end) {
      return 0;
    }
    item->valuedouble = dVar13;
    iVar4 = 0x7fffffff;
    if ((dVar13 < 2147483647.0) && (iVar4 = -0x80000000, -2147483648.0 < dVar13)) {
      iVar4 = (int)dVar13;
    }
    item->valueint = iVar4;
    item->type = 8;
    input_buffer->offset = (size_t)(after_end + (input_buffer->offset - (long)local_78));
    return 1;
  }
  if (uVar1 == '{') {
    if (999 < input_buffer->depth) {
      return 0;
    }
    input_buffer->depth = input_buffer->depth + 1;
    if (*puVar10 != '{') {
      return 0;
    }
    input_buffer->offset = uVar3 + 1;
    buffer_skip_whitespace(input_buffer);
    uVar8 = input_buffer->offset;
    if (uVar8 < input_buffer->length) {
      if (input_buffer->content[uVar8] == '}') {
        item_00 = (cJSON *)0x0;
        pcVar7 = (cJSON *)0x0;
      }
      else {
        input_buffer->offset = uVar8 - 1;
        pcVar11 = (cJSON *)0x0;
        pcVar12 = (cJSON *)0x0;
        do {
          pcVar7 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
          if (pcVar7 == (cJSON *)0x0) goto LAB_00103ae1;
          pcVar7->valuedouble = 0.0;
          pcVar7->string = (char *)0x0;
          pcVar7->valuestring = (char *)0x0;
          *(undefined8 *)&pcVar7->valueint = 0;
          pcVar7->child = (cJSON *)0x0;
          *(undefined8 *)&pcVar7->type = 0;
          pcVar7->next = (cJSON *)0x0;
          pcVar7->prev = (cJSON *)0x0;
          item_00 = pcVar7;
          if (pcVar11 != (cJSON *)0x0) {
            pcVar12->next = pcVar7;
            pcVar7->prev = pcVar12;
            item_00 = pcVar11;
          }
          uVar8 = input_buffer->offset + 1;
          if (input_buffer->length <= uVar8) goto LAB_00103ac8;
          input_buffer->offset = uVar8;
          buffer_skip_whitespace(input_buffer);
          cVar5 = parse_string(pcVar7,input_buffer);
          if (cVar5 == 0) goto LAB_00103ac8;
          buffer_skip_whitespace(input_buffer);
          pcVar7->string = pcVar7->valuestring;
          pcVar7->valuestring = (char *)0x0;
          uVar8 = input_buffer->offset;
          if ((input_buffer->length <= uVar8) || (input_buffer->content[uVar8] != ':'))
          goto LAB_00103ac8;
          input_buffer->offset = uVar8 + 1;
          buffer_skip_whitespace(input_buffer);
          cVar5 = parse_value(pcVar7,input_buffer);
          if (cVar5 == 0) goto LAB_00103ac8;
          buffer_skip_whitespace(input_buffer);
          uVar8 = input_buffer->offset;
          if (input_buffer->length <= uVar8) goto LAB_00103ac8;
          pcVar11 = item_00;
          pcVar12 = pcVar7;
        } while (input_buffer->content[uVar8] == ',');
        if (input_buffer->content[uVar8] != '}') goto LAB_00103ac8;
      }
      input_buffer->depth = input_buffer->depth - 1;
      if (item_00 != (cJSON *)0x0) {
        item_00->prev = pcVar7;
      }
      item->type = 0x40;
      goto LAB_00103918;
    }
  }
  else {
    if (uVar1 != '[') {
      return 0;
    }
    if (999 < input_buffer->depth) {
      return 0;
    }
    input_buffer->depth = input_buffer->depth + 1;
    if (*puVar10 != '[') {
      return 0;
    }
    input_buffer->offset = uVar3 + 1;
    buffer_skip_whitespace(input_buffer);
    uVar8 = input_buffer->offset;
    if (uVar8 < input_buffer->length) {
      if (input_buffer->content[uVar8] == ']') {
        item_00 = (cJSON *)0x0;
        pcVar7 = (cJSON *)0x0;
      }
      else {
        input_buffer->offset = uVar8 - 1;
        pcVar11 = (cJSON *)0x0;
        pcVar12 = (cJSON *)0x0;
        do {
          pcVar7 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
          if (pcVar7 == (cJSON *)0x0) goto LAB_00103ae1;
          pcVar7->valuedouble = 0.0;
          pcVar7->string = (char *)0x0;
          pcVar7->valuestring = (char *)0x0;
          *(undefined8 *)&pcVar7->valueint = 0;
          pcVar7->child = (cJSON *)0x0;
          *(undefined8 *)&pcVar7->type = 0;
          pcVar7->next = (cJSON *)0x0;
          pcVar7->prev = (cJSON *)0x0;
          item_00 = pcVar7;
          if (pcVar11 != (cJSON *)0x0) {
            pcVar12->next = pcVar7;
            pcVar7->prev = pcVar12;
            item_00 = pcVar11;
          }
          input_buffer->offset = input_buffer->offset + 1;
          buffer_skip_whitespace(input_buffer);
          cVar5 = parse_value(pcVar7,input_buffer);
          if (cVar5 == 0) goto LAB_00103ac8;
          buffer_skip_whitespace(input_buffer);
          uVar8 = input_buffer->offset;
          if (input_buffer->length <= uVar8) goto LAB_00103ac8;
          pcVar11 = item_00;
          pcVar12 = pcVar7;
        } while (input_buffer->content[uVar8] == ',');
        if (input_buffer->content[uVar8] != ']') goto LAB_00103ac8;
      }
      input_buffer->depth = input_buffer->depth - 1;
      if (item_00 != (cJSON *)0x0) {
        item_00->prev = pcVar7;
      }
      item->type = 0x20;
LAB_00103918:
      item->child = item_00;
      input_buffer->offset = uVar8 + 1;
      return 1;
    }
  }
  input_buffer->offset = uVar8 - 1;
  return 0;
LAB_00103ae1:
  item_00 = pcVar11;
  if (pcVar11 == (cJSON *)0x0) {
    return 0;
  }
LAB_00103ac8:
  cJSON_Delete(item_00);
  return 0;
}

Assistant:

static cJSON_bool parse_value(cJSON * const item, parse_buffer * const input_buffer)
{
    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false; /* no input */
    }

    /* parse the different types of values */
    /* null */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "null", 4) == 0))
    {
        item->type = cJSON_NULL;
        input_buffer->offset += 4;
        return true;
    }
    /* false */
    if (can_read(input_buffer, 5) && (strncmp((const char*)buffer_at_offset(input_buffer), "false", 5) == 0))
    {
        item->type = cJSON_False;
        input_buffer->offset += 5;
        return true;
    }
    /* true */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "true", 4) == 0))
    {
        item->type = cJSON_True;
        item->valueint = 1;
        input_buffer->offset += 4;
        return true;
    }
    /* string */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '\"'))
    {
        return parse_string(item, input_buffer);
    }
    /* number */
    if (can_access_at_index(input_buffer, 0) && ((buffer_at_offset(input_buffer)[0] == '-') || ((buffer_at_offset(input_buffer)[0] >= '0') && (buffer_at_offset(input_buffer)[0] <= '9'))))
    {
        return parse_number(item, input_buffer);
    }
    /* array */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '['))
    {
        return parse_array(item, input_buffer);
    }
    /* object */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '{'))
    {
        return parse_object(item, input_buffer);
    }

    return false;
}